

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

xformAtomRecords *
deleteXformAtomRecord(xformAtomRecords *xr,abrAtomListProc *delAtomProc,void *deletestuff)

{
  xformAtomRecords *local_28;
  xformAtomRecords *following;
  void *deletestuff_local;
  abrAtomListProc *delAtomProc_local;
  xformAtomRecords *xr_local;
  
  local_28 = (xformAtomRecords *)0x0;
  if (xr != (xformAtomRecords *)0x0) {
    if (xr->a != (atom *)0x0) {
      (*delAtomProc)(xr->a,deletestuff);
      xr->a = (atom *)0x0;
    }
    local_28 = xr->next;
    xr->next = (xformAtomRecords_t *)0x0;
    free(xr);
  }
  return local_28;
}

Assistant:

xformAtomRecords* deleteXformAtomRecord(xformAtomRecords *xr,
            abrAtomListProc delAtomProc, void *deletestuff) {
   xformAtomRecords* following = NULL;
   if (xr) {
      if (xr->a != NULL) {
         delAtomProc(xr->a, deletestuff);
         xr->a = NULL;
      }

      following = xr->next;
      xr->next  = NULL;
      free(xr);
   }
   return following;
}